

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O1

void ExtractPalettedAlphaRows(VP8LDecoder *dec,int last_row)

{
  int iVar1;
  VP8Io *pVVar2;
  void *pvVar3;
  int y_start;
  int *piVar4;
  int iVar5;
  uint8_t *puVar6;
  long lVar7;
  uint8_t *dst;
  uint8_t *puVar8;
  
  pVVar2 = dec->io_;
  pvVar3 = pVVar2->opaque;
  piVar4 = &dec->last_row_;
  if (*(uint *)((long)pvVar3 + 0xc) < 2) {
    piVar4 = &pVVar2->crop_top;
  }
  y_start = *piVar4;
  if (*piVar4 < dec->last_row_) {
    y_start = dec->last_row_;
  }
  iVar5 = last_row - y_start;
  if (iVar5 != 0 && y_start <= last_row) {
    iVar1 = pVVar2->width;
    lVar7 = (long)iVar1;
    dst = (uint8_t *)(lVar7 * y_start + *(long *)((long)pvVar3 + 200));
    VP8LColorIndexInverseTransformAlpha
              (dec->transforms_,y_start,last_row,
               (uint8_t *)((long)dec->width_ * (long)y_start + (long)dec->pixels_),dst);
    if (*(int *)((long)pvVar3 + 0xc) != 0) {
      puVar6 = *(uint8_t **)((long)pvVar3 + 0xd0);
      do {
        (*WebPUnfilters[*(uint *)((long)pvVar3 + 0xc)])(puVar6,dst,dst,iVar1);
        puVar8 = dst + lVar7;
        iVar5 = iVar5 + -1;
        puVar6 = dst;
        dst = puVar8;
      } while (iVar5 != 0);
      *(long *)((long)pvVar3 + 0xd0) = (long)puVar8 - lVar7;
    }
  }
  dec->last_out_row_ = last_row;
  dec->last_row_ = last_row;
  return;
}

Assistant:

static void ExtractPalettedAlphaRows(VP8LDecoder* const dec, int last_row) {
  // For vertical and gradient filtering, we need to decode the part above the
  // crop_top row, in order to have the correct spatial predictors.
  ALPHDecoder* const alph_dec = (ALPHDecoder*)dec->io_->opaque;
  const int top_row =
      (alph_dec->filter_ == WEBP_FILTER_NONE ||
       alph_dec->filter_ == WEBP_FILTER_HORIZONTAL) ? dec->io_->crop_top
                                                    : dec->last_row_;
  const int first_row = (dec->last_row_ < top_row) ? top_row : dec->last_row_;
  assert(last_row <= dec->io_->crop_bottom);
  if (last_row > first_row) {
    // Special method for paletted alpha data. We only process the cropped area.
    const int width = dec->io_->width;
    uint8_t* out = alph_dec->output_ + width * first_row;
    const uint8_t* const in =
      (uint8_t*)dec->pixels_ + dec->width_ * first_row;
    VP8LTransform* const transform = &dec->transforms_[0];
    assert(dec->next_transform_ == 1);
    assert(transform->type_ == COLOR_INDEXING_TRANSFORM);
    VP8LColorIndexInverseTransformAlpha(transform, first_row, last_row,
                                        in, out);
    AlphaApplyFilter(alph_dec, first_row, last_row, out, width);
  }
  dec->last_row_ = dec->last_out_row_ = last_row;
}